

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseThenFinallyFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseThenFinallyFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,RecyclableObject *OnFinally,
          RecyclableObject *Constructor,bool shouldThrow)

{
  ScriptContext *scriptContext;
  DynamicObject *prototype;
  RecyclableObject *entryPoint_00;
  Recycler *pRVar1;
  FunctionInfo *this_00;
  ScriptContext **ppSVar2;
  DynamicObject **ppDVar3;
  DynamicTypeHandler *typeHandler;
  JavascriptPromiseThenFinallyFunction *this_01;
  Var pvVar4;
  InfoBitsWrapper<(Memory::ObjectInfoBits)1> local_a9;
  TrackAllocData local_a8;
  JavascriptPromiseThenFinallyFunction *local_80;
  JavascriptPromiseThenFinallyFunction *function;
  DynamicType *type;
  undefined8 local_68;
  TrackAllocData local_60;
  FunctionInfo *local_38;
  FunctionInfo *functionInfo;
  RecyclableObject *pRStack_28;
  bool shouldThrow_local;
  RecyclableObject *Constructor_local;
  RecyclableObject *OnFinally_local;
  JavascriptMethod entryPoint_local;
  JavascriptLibrary *this_local;
  
  functionInfo._7_1_ = shouldThrow;
  pRStack_28 = Constructor;
  Constructor_local = OnFinally;
  OnFinally_local = (RecyclableObject *)entryPoint;
  entryPoint_local = (JavascriptMethod)this;
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a1a);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_60);
  type = (DynamicType *)Memory::Recycler::AllocInlined;
  local_68 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,(JavascriptMethod)OnFinally_local,ErrorOnNew,0xffffffff,(FunctionProxy *)0x0);
  local_38 = this_00;
  ppSVar2 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  scriptContext = *ppSVar2;
  ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicObject__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).functionPrototype);
  entryPoint_00 = OnFinally_local;
  prototype = *ppDVar3;
  typeHandler = GetDeferredAnonymousFunctionTypeHandler(this);
  function = (JavascriptPromiseThenFinallyFunction *)
             DynamicType::New(scriptContext,TypeIds_Function,&prototype->super_RecyclableObject,
                              (JavascriptMethod)entryPoint_00,typeHandler,false,false);
  pRVar1 = GetRecycler(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_a8,(type_info *)&JavascriptPromiseThenFinallyFunction::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1a1d);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_a8);
  this_01 = (JavascriptPromiseThenFinallyFunction *)
            new<(Memory::ObjectInfoBits)1>(0x58,pRVar1,&local_a9);
  JavascriptPromiseThenFinallyFunction::JavascriptPromiseThenFinallyFunction
            (this_01,(DynamicType *)function,local_38,Constructor_local,pRStack_28,
             (bool)(functionInfo._7_1_ & 1));
  local_80 = this_01;
  pvVar4 = TaggedInt::ToVarUnchecked(1);
  (*(this_01->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(this_01,0xd1,pvVar4,2,0,0,0xf);
  return local_80;
}

Assistant:

JavascriptPromiseThenFinallyFunction* JavascriptLibrary::CreatePromiseThenFinallyFunction(JavascriptMethod entryPoint, RecyclableObject* OnFinally, RecyclableObject* Constructor, bool shouldThrow)
    {
        FunctionInfo* functionInfo = RecyclerNew(this->GetRecycler(), FunctionInfo, entryPoint, FunctionInfo::Attributes::ErrorOnNew);
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());

        JavascriptPromiseThenFinallyFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseThenFinallyFunction, type, functionInfo, OnFinally, Constructor, shouldThrow);
        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }